

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O0

void __thiscall
validation_layer::eventsChecker::ZEeventsChecker::resetEventInEventToDagID
          (ZEeventsChecker *this,string *zeCallDisc,ze_event_handle_t hEvent)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  pointer ppVar4;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
  local_38;
  iterator action;
  _Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false> local_28;
  iterator it;
  ze_event_handle_t hEvent_local;
  string *zeCallDisc_local;
  ZEeventsChecker *this_local;
  
  it.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>._M_cur =
       (_Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>)
       (_Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>)hEvent;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
       ::find(&this->eventToDagID,(key_type *)&it);
  action.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
             )std::
              unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
              ::end(&this->eventToDagID);
  bVar1 = std::__detail::operator==
                    (&local_28,
                     (_Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                      *)&action);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Warning: hSignalEvent {");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,(void *)it.
                                       super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                                       ._M_cur);
    poVar2 = std::operator<<(poVar2,"} might be an invalid event in call to ");
    poVar2 = std::operator<<(poVar2,(string *)zeCallDisc);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>::
             operator->((_Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>
                         *)&local_28);
    if (ppVar3->second != 0xffffffff) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>::
               operator->((_Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>
                           *)&local_28);
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>_>
           ::find(&this->dagIDToAction,&ppVar3->second);
      local_40._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>_>
           ::end(&this->dagIDToAction);
      bVar1 = std::__detail::operator!=(&local_38,&local_40);
      if (bVar1) {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false,_false>
                               *)&local_38);
        (ppVar4->second).second = (_ze_event_handle_t *)0x0;
      }
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>::
               operator->((_Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>
                           *)&local_28);
      ppVar3->second = 0xffffffff;
    }
  }
  return;
}

Assistant:

void eventsChecker::ZEeventsChecker::resetEventInEventToDagID(
    const std::string &zeCallDisc, /// action discription
    const ze_event_handle_t hEvent ///< [in] handle of the event
) {
    auto it = eventToDagID.find(hEvent);
    // Check if user is using invalid events, hint if it doesn't exist in eventToDagID.
    if (it == eventToDagID.end()) {
        std::cerr << "Warning: hSignalEvent {" << hEvent << "} might be an invalid event in call to " << zeCallDisc << std::endl;
        return;
    }

    if (it->second != invalidDagID) {

        auto action = dagIDToAction.find(it->second);
        if (action != dagIDToAction.end()) {
            action->second.second = invalidEventAddress; // Reset
        }

        it->second = invalidDagID; // Reset
    }
}